

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

void Abc_NtkFrameExtend(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void *EntryEven;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *p_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  long *plVar7;
  void **EntryOdd;
  int iVar8;
  int iVar9;
  int nCapMin;
  int iVar10;
  long lVar11;
  
  iVar8 = pNtk->nConstrs;
  if (iVar8 == 0) {
    return;
  }
  iVar9 = pNtk->vPis->nSize;
  if (iVar9 < iVar8) {
    __assert_fail("Abc_NtkPiNum(pNtk) >= pNtk->nConstrs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                  ,0x111,"void Abc_NtkFrameExtend(Abc_Ntk_t *)");
  }
  iVar1 = pNtk->vPos->nSize;
  if (iVar1 < iVar8 * 4) {
    __assert_fail("Abc_NtkPoNum(pNtk) >= pNtk->nConstrs * 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                  ,0x112,"void Abc_NtkFrameExtend(Abc_Ntk_t *)");
  }
  p = Vec_PtrAlloc(pNtk->nObjCounts[7]);
  for (iVar8 = 0; iVar8 < pNtk->vObjs->nSize; iVar8 = iVar8 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar8);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
      iVar10 = p->nSize;
      if (iVar10 == p->nCap) {
        nCapMin = iVar10 * 2;
        if (iVar10 < 0x10) {
          nCapMin = 0x10;
        }
        Vec_PtrGrow(p,nCapMin);
        iVar10 = p->nSize;
      }
      p->nSize = iVar10 + 1;
      p->pArray[iVar10] = pAVar2;
    }
  }
  p_00 = Vec_PtrAlloc(2);
  iVar10 = iVar1 + iVar9 * -4 + 1;
  iVar8 = 0;
  while( true ) {
    if (pNtk->vPis->nSize <= iVar8) break;
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis,iVar8);
    if (iVar9 == iVar8) break;
    if (iVar8 < iVar9 - pNtk->nConstrs) {
      Abc_NtkDupObj(pNtk,pAVar2,0);
      pAVar4 = (pAVar2->field_6).pCopy;
      pcVar3 = Abc_ObjName(pAVar2);
      Abc_ObjAssignName(pAVar4,pcVar3,"_frame1");
    }
    else {
      pAVar4 = Abc_NtkPo(pNtk,iVar10);
      pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
      pAVar5 = Abc_NtkPo(pNtk,iVar10 + 1);
      pAVar5 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
      pAVar6 = Abc_NtkPo(pNtk,iVar10 + 2);
      EntryOdd = pAVar6->pNtk->vObjs->pArray;
      EntryEven = EntryOdd[*(pAVar6->vFanins).pArray];
      pAVar4 = Abc_NtkCreateNodeInv(pNtk,pAVar4);
      pAVar6 = Abc_NtkCreateNodeInv(pNtk,pAVar5);
      Vec_PtrFillTwo(p_00,(int)pAVar6,pAVar2,EntryOdd);
      pAVar6 = Abc_NtkCreateNodeAnd(pNtk,p_00);
      Vec_PtrFillTwo(p_00,(int)pAVar5,EntryEven,EntryOdd);
      pAVar5 = Abc_NtkCreateNodeAnd(pNtk,p_00);
      Vec_PtrFillTwo(p_00,(int)pAVar6,pAVar5,EntryOdd);
      pAVar5 = Abc_NtkCreateNodeOr(pNtk,p_00);
      Vec_PtrFillTwo(p_00,(int)pAVar4,pAVar5,EntryOdd);
      pAVar4 = Abc_NtkCreateNodeAnd(pNtk,p_00);
      (pAVar2->field_6).pCopy = pAVar4;
    }
    iVar8 = iVar8 + 1;
    iVar10 = iVar10 + 4;
  }
  iVar8 = p->nSize;
  iVar9 = 0;
  if (iVar8 < 1) {
    iVar8 = 0;
    iVar9 = 0;
  }
  for (; iVar8 != iVar9; iVar9 = iVar9 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar9);
    Abc_NtkDupObj(pNtk,pAVar2,0);
  }
  for (iVar9 = 0; iVar9 != iVar8; iVar9 = iVar9 + 1) {
    plVar7 = (long *)Vec_PtrEntry(p,iVar9);
    for (lVar11 = 0; lVar11 < *(int *)((long)plVar7 + 0x1c); lVar11 = lVar11 + 1) {
      Abc_ObjAddFanin((Abc_Obj_t *)plVar7[8],
                      *(Abc_Obj_t **)
                       (*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                 (long)*(int *)(plVar7[4] + lVar11 * 4) * 8) + 0x40));
    }
  }
  for (iVar8 = 0; iVar8 < pNtk->vPos->nSize; iVar8 = iVar8 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,iVar8);
    if (iVar1 == iVar8) break;
    if (iVar8 < iVar1 + pNtk->nConstrs * -4) {
      Abc_NtkDupObj(pNtk,pAVar2,0);
      pAVar4 = (pAVar2->field_6).pCopy;
      pcVar3 = Abc_ObjName(pAVar2);
      Abc_ObjAssignName(pAVar4,pcVar3,"_frame1");
      Abc_ObjAddFanin((pAVar2->field_6).pCopy,
                      *(Abc_Obj_t **)
                       ((long)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray] + 0x40));
    }
    else {
      pAVar4 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
      Abc_ObjPatchFanin(pAVar2,pAVar4,(pAVar4->field_6).pCopy);
    }
  }
  Vec_PtrFree(p_00);
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_NtkFrameExtend( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vFanins, * vNodes;
    Abc_Obj_t * pObj, * pFanin, * pReset, * pEnable, * pSignal;
    Abc_Obj_t * pResetN, * pEnableN, * pAnd0, * pAnd1, * pMux;
    int i, k, iStartPo, nPisOld = Abc_NtkPiNum(pNtk), nPosOld = Abc_NtkPoNum(pNtk);
    // skip if there are no flops
    if ( pNtk->nConstrs == 0 )
        return;
    assert( Abc_NtkPiNum(pNtk) >= pNtk->nConstrs );
    assert( Abc_NtkPoNum(pNtk) >= pNtk->nConstrs * 4 );
    // collect nodes
    vNodes = Vec_PtrAlloc( Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        Vec_PtrPush( vNodes, pObj );
    // duplicate PIs
    vFanins = Vec_PtrAlloc( 2 );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        if ( i == nPisOld )
            break;
        if ( i < nPisOld - pNtk->nConstrs )
        {
            Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_frame1" );
            continue;
        }
        // create flop input
        iStartPo = nPosOld + 4 * (i - nPisOld);
        pReset   = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 1 ) );
        pEnable  = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 2 ) );
        pSignal  = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 3 ) );
        pResetN  = Abc_NtkCreateNodeInv( pNtk, pReset );
        pEnableN = Abc_NtkCreateNodeInv( pNtk, pEnable );
        Vec_PtrFillTwo( vFanins, 2, pEnableN, pObj );
        pAnd0    = Abc_NtkCreateNodeAnd( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pEnable, pSignal );
        pAnd1    = Abc_NtkCreateNodeAnd( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pAnd0, pAnd1 );
        pMux     = Abc_NtkCreateNodeOr( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pResetN, pMux );
        pObj->pCopy = Abc_NtkCreateNodeAnd( pNtk, vFanins );
    }
    // duplicate internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_NtkDupObj( pNtk, pObj, 0 );
    // connect objects
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // create new POs and reconnect flop inputs
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( i == nPosOld )
            break;
        if ( i < nPosOld - 4 * pNtk->nConstrs )
        {
            Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_frame1" );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pObj)->pCopy );
            continue;
        }
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), Abc_ObjFanin0(pObj)->pCopy );
    }
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vNodes );
}